

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddExtension<google::protobuf::FieldDescriptorProto>
          (DescriptorIndex *this,string_view filename,FieldDescriptorProto *field)

{
  String *__return_storage_ptr__;
  size_t sVar1;
  char *pcVar2;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  __first;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  __last;
  string_view v;
  bool bVar3;
  undefined8 *puVar4;
  LogMessage *pLVar5;
  string_view str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  size_t local_b0;
  char *local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_a0;
  value_type local_78;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*>,_bool>
  local_48;
  
  local_a8 = filename._M_str;
  local_b0 = filename._M_len;
  puVar4 = (undefined8 *)
           ((ulong)(field->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  sVar1 = puVar4[1];
  bVar3 = true;
  if ((sVar1 != 0) && (pcVar2 = (char *)*puVar4, *pcVar2 == '.')) {
    local_78.data_offset =
         (int)(((long)(this->all_values_).
                      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->all_values_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) + -1;
    __return_storage_ptr__ = &local_78.encoded_extendee;
    str._M_str = pcVar2;
    str._M_len = sVar1;
    EncodeString_abi_cxx11_(__return_storage_ptr__,this,str);
    local_78.extension_number = (field->field_0)._impl_.number_;
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
    ::insert(&local_48,
             &(this->by_extension_).
              super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
             ,&local_78);
    if (local_48.second == true) {
      __first._M_current =
           (this->by_extension_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->by_extension_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::substr
                ((ulong)&local_d0,
                 (ulong)(field->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      local_a0.first._M_string_length = local_c8;
      local_a0.second = (field->field_0)._impl_.number_;
      local_a0.first._M_dataplus._M_p = (pointer)&local_a0.first.field_2;
      if (local_d0 == &local_c0) {
        local_a0.first.field_2._8_8_ = local_c0._8_8_;
      }
      else {
        local_a0.first._M_dataplus._M_p = (pointer)local_d0;
      }
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      local_d0 = &local_c0;
      bVar3 = std::
              binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::pair<std::__cxx11::string,int>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                        (__first,__last,&local_a0,
                         (this->by_extension_).
                         super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                         .
                         super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                         .tree_.rightmost_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>::checked_compare,_0UL,_false>
                         .value.
                         super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_true>
                         .super_ExtensionCompare.index);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      if (!bVar3) {
        return true;
      }
    }
    else {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x319);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       ((LogMessage *)&local_78,
                        (char (*) [64])
                        "Extension conflicts with extension already in database: extend ");
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar5,(string *)
                               ((ulong)(field->field_0)._impl_.extendee_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc));
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,(char (*) [4])" { ");
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar5,(string *)
                               ((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc));
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,(char (*) [4])0x35a41a)
    ;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar5,(field->field_0)._impl_.number_);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar5,(char (*) [9])" } from:");
    v._M_str = local_a8;
    v._M_len = local_b0;
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,v);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_78);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddSymbol(
    absl::string_view name, Value value) {
  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(name)) {
    ABSL_LOG(ERROR) << "Invalid symbol name: " << name;
    return false;
  }

  // Try to look up the symbol to make sure a super-symbol doesn't already
  // exist.
  auto iter = FindLastLessOrEqual(&by_symbol_, name);

  if (iter == by_symbol_.end()) {
    // Apparently the map is currently empty.  Just insert and be done with it.
    by_symbol_.try_emplace(name, value);
    return true;
  }

  if (IsSubSymbol(iter->first, name)) {
    ABSL_LOG(ERROR) << "Symbol name \"" << name
                    << "\" conflicts with the existing "
                       "symbol \""
                    << iter->first << "\".";
    return false;
  }

  // OK, that worked.  Now we have to make sure that no symbol in the map is
  // a sub-symbol of the one we are inserting.  The only symbol which could
  // be so is the first symbol that is greater than the new symbol.  Since
  // |iter| points at the last symbol that is less than or equal, we just have
  // to increment it.
  ++iter;

  if (iter != by_symbol_.end() && IsSubSymbol(name, iter->first)) {
    ABSL_LOG(ERROR) << "Symbol name \"" << name
                    << "\" conflicts with the existing "
                       "symbol \""
                    << iter->first << "\".";
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter, {std::string(name), value});

  return true;
}